

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser.cpp
# Opt level: O0

void __thiscall CServerBrowser::CServerBrowser(CServerBrowser *this)

{
  undefined8 *in_RDI;
  int i;
  CServerBrowserFavorites *in_stack_ffffffffffffffa0;
  undefined8 *local_30;
  int local_18;
  
  IServerBrowser::IServerBrowser((IServerBrowser *)in_stack_ffffffffffffffa0);
  *in_RDI = &PTR__CServerBrowser_00297cb0;
  CServerBrowserFavorites::CServerBrowserFavorites(in_stack_ffffffffffffffa0);
  CServerBrowserFilter::CServerBrowserFilter((CServerBrowserFilter *)0x13538c);
  local_30 = in_RDI + 0x17bf;
  do {
    CServerlist::CServerlist((CServerlist *)0x1353c1);
    local_30 = local_30 + 0x104;
  } while (local_30 != in_RDI + 0x19c7);
  in_RDI[6] = 0;
  for (local_18 = 0; local_18 < 2; local_18 = local_18 + 1) {
    CServerlist::Clear((CServerlist *)in_stack_ffffffffffffffa0);
    *(undefined4 *)((long)in_RDI + (long)local_18 * 0x820 + 0xbe0c) = 0;
    in_RDI[(long)local_18 * 0x104 + 0x18c2] = 0;
  }
  in_RDI[0x19c7] = 0;
  in_RDI[0x19c8] = 0;
  *(undefined4 *)(in_RDI + 0x19c9) = 0;
  *(undefined4 *)((long)in_RDI + 0xce4c) = 0;
  *(undefined4 *)(in_RDI + 0x19cb) = 0;
  *(undefined1 *)(in_RDI + 0x19ca) = 0;
  *(undefined4 *)((long)in_RDI + 0xce54) = 1;
  *(undefined4 *)(in_RDI + 0x17be) = 0;
  in_RDI[0x19cc] = 0;
  in_RDI[0x19cd] = 0;
  return;
}

Assistant:

CServerBrowser::CServerBrowser()
{
	m_pMasterServer = 0;

	//
	for(int i = 0; i < NUM_TYPES; ++i)
	{
		m_aServerlist[i].Clear();
		m_aServerlist[i].m_NumServerCapacity = 0;
		m_aServerlist[i].m_ppServerlist = 0;
	}

	m_pFirstReqServer = 0; // request list
	m_pLastReqServer = 0;
	m_NumRequests = 0;

	m_NeedRefresh = 0;
	m_RefreshFlags = 0;
	m_InfoUpdated = false;

	// the token is to keep server refresh separated from each other
	m_CurrentLanToken = 1;

	m_ActServerlistType = 0;
	m_BroadcastTime = 0;
	m_MasterRefreshTime = 0;
}